

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_handle_incoming_commands(ENetHost *host,ENetEvent *event)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  enet_uint32 eVar5;
  int iVar6;
  ENetProtocol *pEVar7;
  ENetProtocol *pEVar8;
  ENetHost *in_RSI;
  ENetHost *in_RDI;
  enet_uint16 sentTime;
  size_t commandSize;
  enet_uint8 commandNumber;
  ENetBuffer buffer;
  enet_uint32 desiredChecksum;
  enet_uint32 *checksum;
  size_t originalSize;
  enet_uint8 sessionID;
  enet_uint32 flags;
  enet_uint32 peerID;
  size_t headerSize;
  enet_uint8 *currentData;
  ENetPeer *peer;
  ENetProtocol *command;
  ENetProtocolHeader *header;
  ENetProtocol *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  ENetPeerState in_stack_ffffffffffffff64;
  enet_uint16 sentTime_00;
  enet_uint32 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  uint16_t in_stack_ffffffffffffff76;
  ENetHost *host_00;
  undefined7 in_stack_ffffffffffffff80;
  ENetHost *in_stack_ffffffffffffff88;
  enet_uint8 **in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  enet_uint32 in_stack_ffffffffffffff9c;
  ENetPeer *in_stack_ffffffffffffffa0;
  ENetHost *in_stack_ffffffffffffffa8;
  size_t local_40;
  ENetProtocol *local_38;
  ENetPeer *peer_00;
  ENetPeer *peer_01;
  int local_4;
  
  if (in_RDI->receivedDataLength < 4) {
    return 0;
  }
  peer_01 = (ENetPeer *)in_RDI->receivedData;
  uVar3 = ntohl(*(uint32_t *)&(peer_01->dispatchList).next);
  uVar4 = uVar3 & 0xf0ffffff;
  local_40 = 4;
  if ((uVar3 & 0x8000000) != 0) {
    local_40 = 6;
  }
  if (in_RDI->checksum != (ENetChecksumCallback)0x0) {
    local_40 = local_40 + 4;
  }
  if (uVar4 == 0xffffff) {
    peer_00 = (ENetPeer *)0x0;
  }
  else {
    if (in_RDI->peerCount <= (ulong)uVar4) {
      return 0;
    }
    peer_00 = in_RDI->peer_list[uVar4];
    if ((((peer_00->state == ENET_PEER_STATE_DISCONNECTED) ||
         (peer_00->state == ENET_PEER_STATE_ZOMBIE)) ||
        ((((in_RDI->receivedAddress).host != (peer_00->address).host ||
          ((in_RDI->receivedAddress).port != (peer_00->address).port)) &&
         ((peer_00->address).host != 0xffffffff)))) ||
       ((peer_00->outgoingPeerID < 0xffffff &&
        (((byte)(uVar3 >> 0x18) & 3) != peer_00->incomingSessionID)))) {
      return 0;
    }
  }
  if ((uVar3 & 0x4000000) != 0) {
    if (((in_RDI->compressor).context == (void *)0x0) ||
       ((in_RDI->compressor).decompress ==
        (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0)) {
      return 0;
    }
    in_stack_ffffffffffffffa8 =
         (ENetHost *)
         (*(in_RDI->compressor).decompress)
                   ((in_RDI->compressor).context,in_RDI->receivedData + local_40,
                    in_RDI->receivedDataLength - local_40,in_RDI->packetData[1] + local_40,
                    0x1000 - local_40);
    if ((in_stack_ffffffffffffffa8 == (ENetHost *)0x0) ||
       ((ENetHost *)(0x1000 - local_40) < in_stack_ffffffffffffffa8)) {
      return 0;
    }
    memcpy(in_RDI->packetData + 1,peer_01,local_40);
    in_RDI->receivedData = in_RDI->packetData[1];
    in_RDI->receivedDataLength = (long)in_stack_ffffffffffffffa8->commands + (local_40 - 0x6c);
  }
  if (in_RDI->checksum != (ENetChecksumCallback)0x0) {
    in_stack_ffffffffffffffa0 = (ENetPeer *)(in_RDI->receivedData + (local_40 - 4));
    in_stack_ffffffffffffff9c = *(enet_uint32 *)&(in_stack_ffffffffffffffa0->dispatchList).next;
    if (peer_00 == (ENetPeer *)0x0) {
      in_stack_ffffffffffffff70 = 0;
    }
    else {
      in_stack_ffffffffffffff70 = peer_00->connectID;
    }
    *(enet_uint32 *)&(in_stack_ffffffffffffffa0->dispatchList).next = in_stack_ffffffffffffff70;
    in_stack_ffffffffffffff88 = (ENetHost *)in_RDI->receivedData;
    in_stack_ffffffffffffff90 = (enet_uint8 **)in_RDI->receivedDataLength;
    eVar5 = (*in_RDI->checksum)((ENetBuffer *)&stack0xffffffffffffff88,1);
    if (eVar5 != in_stack_ffffffffffffff9c) {
      return 0;
    }
  }
  if (peer_00 != (ENetPeer *)0x0) {
    (peer_00->address).host = (in_RDI->receivedAddress).host;
    (peer_00->address).port = (in_RDI->receivedAddress).port;
    peer_00->incomingDataTotal = peer_00->incomingDataTotal + (int)in_RDI->receivedDataLength;
  }
  local_38 = (ENetProtocol *)(in_RDI->receivedData + local_40);
  while ((((local_38 < (ENetProtocol *)(in_RDI->receivedData + in_RDI->receivedDataLength) &&
           (&(local_38->acknowledge).receivedReliableSequenceNumber <=
            in_RDI->receivedData + in_RDI->receivedDataLength)) &&
          (bVar1 = (local_38->header).command & 0xf, bVar1 < 0xd)) &&
         (((host_00 = (ENetHost *)commandSizes[bVar1], host_00 != (ENetHost *)0x0 &&
           ((enet_uint8 *)((long)local_38 + (long)host_00) <=
            in_RDI->receivedData + in_RDI->receivedDataLength)) &&
          ((pEVar7 = (ENetProtocol *)((long)local_38 + (long)((long)host_00->commands + -0x6c)),
           peer_00 != (ENetPeer *)0x0 || (bVar1 == 2))))))) {
    uVar2 = ntohs((local_38->header).reliableSequenceNumber);
    (local_38->header).reliableSequenceNumber = uVar2;
    pEVar8 = (ENetProtocol *)(ulong)(bVar1 - 1);
    switch(pEVar8) {
    case (ENetProtocol *)0x0:
      iVar6 = enet_protocol_handle_acknowledge
                        (in_stack_ffffffffffffff88,
                         (ENetEvent *)CONCAT17(bVar1,in_stack_ffffffffffffff80),(ENetPeer *)host_00,
                         (ENetProtocol *)
                         CONCAT26(in_stack_ffffffffffffff76,
                                  CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)));
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      goto joined_r0x0010aae6;
    case (ENetProtocol *)0x1:
      if (peer_00 == (ENetPeer *)0x0) {
        peer_00 = enet_protocol_handle_connect(in_RSI,(ENetProtocolHeader *)peer_01,local_38);
        sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
        pEVar8 = local_38;
        if (peer_00 != (ENetPeer *)0x0) goto LAB_0010ac4c;
      }
      goto switchD_0010aa24_default;
    case (ENetProtocol *)0x2:
      iVar6 = enet_protocol_handle_verify_connect
                        (host_00,(ENetEvent *)
                                 CONCAT26(in_stack_ffffffffffffff76,
                                          CONCAT24(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70)),
                         (ENetPeer *)&pEVar8->header,
                         (ENetProtocol *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      goto joined_r0x0010aae6;
    case (ENetProtocol *)0x3:
      iVar6 = enet_protocol_handle_disconnect
                        ((ENetHost *)&pEVar8->header,
                         (ENetPeer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
joined_r0x0010aae6:
      pEVar8 = local_38;
      if (iVar6 == 0) goto LAB_0010ac4c;
      goto switchD_0010aa24_default;
    case (ENetProtocol *)0x4:
      iVar6 = enet_protocol_handle_ping(in_RDI,peer_00,local_38);
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      break;
    case (ENetProtocol *)0x5:
      iVar6 = enet_protocol_handle_send_reliable
                        (host_00,(ENetPeer *)
                                 CONCAT26(in_stack_ffffffffffffff76,
                                          CONCAT24(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70)),pEVar8,
                         (enet_uint8 **)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      break;
    case (ENetProtocol *)0x6:
      iVar6 = enet_protocol_handle_send_unreliable
                        (host_00,(ENetPeer *)
                                 CONCAT26(in_stack_ffffffffffffff76,
                                          CONCAT24(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70)),pEVar8,
                         (enet_uint8 **)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      break;
    case (ENetProtocol *)0x7:
      iVar6 = enet_protocol_handle_send_fragment(in_RSI,peer_01,local_38,(enet_uint8 **)peer_00);
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      break;
    case (ENetProtocol *)0x8:
      iVar6 = enet_protocol_handle_send_unsequenced
                        (host_00,(ENetPeer *)
                                 CONCAT26(in_stack_ffffffffffffff76,
                                          CONCAT24(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70)),pEVar8,
                         (enet_uint8 **)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      break;
    case (ENetProtocol *)0x9:
      iVar6 = enet_protocol_handle_bandwidth_limit
                        ((ENetHost *)&pEVar8->header,
                         (ENetPeer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      break;
    case (ENetProtocol *)0xa:
      iVar6 = enet_protocol_handle_throttle_configure
                        ((ENetHost *)&pEVar8->header,
                         (ENetPeer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      break;
    case (ENetProtocol *)0xb:
      iVar6 = enet_protocol_handle_send_unreliable_fragment
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         (ENetProtocol *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff90);
      sentTime_00 = (enet_uint16)((ulong)pEVar8 >> 0x30);
      break;
    default:
      goto switchD_0010aa24_default;
    }
    pEVar8 = local_38;
    if (iVar6 != 0) break;
LAB_0010ac4c:
    local_38 = pEVar7;
    if ((peer_00 != (ENetPeer *)0x0) && (((pEVar8->header).command & 0x80) != 0)) {
      if ((uVar3 & 0x8000000) == 0) break;
      in_stack_ffffffffffffff76 = ntohs(*(uint16_t *)((long)&(peer_01->dispatchList).next + 4));
      in_stack_ffffffffffffff64 = peer_00->state;
      if (((in_stack_ffffffffffffff64 != ENET_PEER_STATE_DISCONNECTED) &&
          (in_stack_ffffffffffffff64 != ENET_PEER_STATE_ACKNOWLEDGING_CONNECT)) &&
         (in_stack_ffffffffffffff64 != ENET_PEER_STATE_DISCONNECTING)) {
        if (in_stack_ffffffffffffff64 == ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT) {
          if (((pEVar8->header).command & 0xf) == 4) {
            enet_peer_queue_acknowledgement
                      ((ENetPeer *)host_00,
                       (ENetProtocol *)
                       CONCAT26(in_stack_ffffffffffffff76,
                                CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
                       sentTime_00);
          }
        }
        else if (in_stack_ffffffffffffff64 != ENET_PEER_STATE_ZOMBIE) {
          enet_peer_queue_acknowledgement
                    ((ENetPeer *)host_00,
                     (ENetProtocol *)
                     CONCAT26(in_stack_ffffffffffffff76,
                              CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
                     sentTime_00);
        }
      }
    }
  }
switchD_0010aa24_default:
  if ((in_RSI == (ENetHost *)0x0) || (in_RSI->socket == 0)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
enet_protocol_handle_incoming_commands (ENetHost * host, ENetEvent * event)
{
    ENetProtocolHeader * header;
    ENetProtocol * command;
    ENetPeer * peer;
    enet_uint8 * currentData;
    size_t headerSize;
    enet_uint32 peerID, flags;
    enet_uint8 sessionID;

    if (host -> receivedDataLength < (size_t) & ((ENetProtocolHeader *) 0) -> sentTime)
      return 0;

    header = (ENetProtocolHeader *) host -> receivedData;

    peerID = ENET_NET_TO_HOST_32 (header -> peerID);
    sessionID = (peerID & ENET_PROTOCOL_HEADER_SESSION_MASK) >> ENET_PROTOCOL_HEADER_SESSION_SHIFT;
    flags = peerID & ENET_PROTOCOL_HEADER_FLAG_MASK;
    peerID &= ~ (ENET_PROTOCOL_HEADER_FLAG_MASK | ENET_PROTOCOL_HEADER_SESSION_MASK);

    headerSize = (flags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME ? sizeof (ENetProtocolHeader) : (size_t) & ((ENetProtocolHeader *) 0) -> sentTime);
    if (host -> checksum != NULL)
      headerSize += sizeof (enet_uint32);

    if (peerID == ENET_PROTOCOL_MAXIMUM_PEER_ID)
      peer = NULL;
    else
    if (peerID >= host -> peerCount)
      return 0;
    else
    {
       peer = host -> peer_list [peerID];

       if (peer -> state == ENET_PEER_STATE_DISCONNECTED ||
           peer -> state == ENET_PEER_STATE_ZOMBIE ||
           ((host -> receivedAddress.host != peer -> address.host ||
             host -> receivedAddress.port != peer -> address.port) &&
             peer -> address.host != ENET_HOST_BROADCAST) ||
           (peer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID &&
            sessionID != peer -> incomingSessionID))
         return 0;
    }
 
    if (flags & ENET_PROTOCOL_HEADER_FLAG_COMPRESSED)
    {
        size_t originalSize;
        if (host -> compressor.context == NULL || host -> compressor.decompress == NULL)
          return 0;

        originalSize = host -> compressor.decompress (host -> compressor.context,
                                    host -> receivedData + headerSize, 
                                    host -> receivedDataLength - headerSize, 
                                    host -> packetData [1] + headerSize, 
                                    sizeof (host -> packetData [1]) - headerSize);
        if (originalSize <= 0 || originalSize > sizeof (host -> packetData [1]) - headerSize)
          return 0;

        memcpy (host -> packetData [1], header, headerSize);
        host -> receivedData = host -> packetData [1];
        host -> receivedDataLength = headerSize + originalSize;
    }

    if (host -> checksum != NULL)
    {
        enet_uint32 * checksum = (enet_uint32 *) & host -> receivedData [headerSize - sizeof (enet_uint32)],
                    desiredChecksum = * checksum;
        ENetBuffer buffer;

        * checksum = peer != NULL ? peer -> connectID : 0;

        buffer.data = host -> receivedData;
        buffer.dataLength = host -> receivedDataLength;

        if (host -> checksum (& buffer, 1) != desiredChecksum)
          return 0;
    }
       
    if (peer != NULL)
    {
       peer -> address.host = host -> receivedAddress.host;
       peer -> address.port = host -> receivedAddress.port;
       peer -> incomingDataTotal += host -> receivedDataLength;
    }
    
    currentData = host -> receivedData + headerSize;
  
    while (currentData < & host -> receivedData [host -> receivedDataLength])
    {
       enet_uint8 commandNumber;
       size_t commandSize;

       command = (ENetProtocol *) currentData;

       if (currentData + sizeof (ENetProtocolCommandHeader) > & host -> receivedData [host -> receivedDataLength])
         break;

       commandNumber = command -> header.command & ENET_PROTOCOL_COMMAND_MASK;
       if (commandNumber >= ENET_PROTOCOL_COMMAND_COUNT) 
         break;
       
       commandSize = commandSizes [commandNumber];
       if (commandSize == 0 || currentData + commandSize > & host -> receivedData [host -> receivedDataLength])
         break;

       currentData += commandSize;

       if (peer == NULL && commandNumber != ENET_PROTOCOL_COMMAND_CONNECT)
         break;
         
       command -> header.reliableSequenceNumber = ENET_NET_TO_HOST_16 (command -> header.reliableSequenceNumber);

       switch (commandNumber)
       {
       case ENET_PROTOCOL_COMMAND_ACKNOWLEDGE:
          if (enet_protocol_handle_acknowledge (host, event, peer, command))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_CONNECT:
          if (peer != NULL)
            goto commandError;
          peer = enet_protocol_handle_connect (host, header, command);
          if (peer == NULL)
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_VERIFY_CONNECT:
          if (enet_protocol_handle_verify_connect (host, event, peer, command))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_DISCONNECT:
          if (enet_protocol_handle_disconnect (host, peer, command))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_PING:
          if (enet_protocol_handle_ping (host, peer, command))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_SEND_RELIABLE:
          if (enet_protocol_handle_send_reliable (host, peer, command, & currentData))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE:
          if (enet_protocol_handle_send_unreliable (host, peer, command, & currentData))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED:
          if (enet_protocol_handle_send_unsequenced (host, peer, command, & currentData))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_SEND_FRAGMENT:
          if (enet_protocol_handle_send_fragment (host, peer, command, & currentData))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT:
          if (enet_protocol_handle_bandwidth_limit (host, peer, command))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_THROTTLE_CONFIGURE:
          if (enet_protocol_handle_throttle_configure (host, peer, command))
            goto commandError;
          break;

       case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE_FRAGMENT:
          if (enet_protocol_handle_send_unreliable_fragment (host, peer, command, & currentData))
            goto commandError;
          break;

       default:
          goto commandError;
       }

       if (peer != NULL &&
           (command -> header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) != 0)
       {
           enet_uint16 sentTime;

           if (! (flags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME))
             break;

           sentTime = ENET_NET_TO_HOST_16 (header -> sentTime);

           switch (peer -> state)
           {
           case ENET_PEER_STATE_DISCONNECTING:
           case ENET_PEER_STATE_ACKNOWLEDGING_CONNECT:
           case ENET_PEER_STATE_DISCONNECTED:
           case ENET_PEER_STATE_ZOMBIE:
              break;

           case ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT:
              if ((command -> header.command & ENET_PROTOCOL_COMMAND_MASK) == ENET_PROTOCOL_COMMAND_DISCONNECT)
                enet_peer_queue_acknowledgement (peer, command, sentTime);
              break;

           default:   
              enet_peer_queue_acknowledgement (peer, command, sentTime);        
              break;
           }
       }
    }

commandError:
    if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
      return 1;

    return 0;
}